

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  UInt64 *pUVar1;
  uint *puVar2;
  byte bVar3;
  ushort uVar4;
  UInt64 UVar5;
  CRangeEnc *pCVar6;
  CProbPrice *ProbPrices;
  CLzmaProb (*paCVar7) [64];
  UInt32 UVar8;
  SRes SVar9;
  CLzmaProb (*paCVar10) [16];
  undefined4 extraout_var;
  Byte *pBVar11;
  ulong uVar12;
  Byte *pBVar13;
  byte *pbVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  uint repIndex;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  COptimal *pCVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  COptimal *pCVar27;
  uint uVar28;
  uint uVar29;
  void *pvVar30;
  COptimal *in_R8;
  int iVar31;
  CProbPrice CVar32;
  long lVar33;
  UInt32 (*paUVar34) [272];
  uint m;
  UInt32 UVar35;
  uint uVar36;
  int iVar37;
  Byte *pBVar38;
  CLzmaProb *pCVar39;
  uint uVar40;
  uint uVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  uint numPairs_1;
  uint numPairs;
  uint repLens [4];
  ulong local_1a8;
  UInt32 local_194;
  uint local_18c;
  Byte *local_188;
  CRangeEnc *local_180;
  uint local_178 [3];
  UInt32 local_16c;
  Byte *local_168;
  CLzmaProb (*local_160) [16];
  ulong local_158;
  int local_150;
  uint local_14c;
  UInt32 (*local_148) [272];
  CProbPrice *local_140;
  ulong local_138;
  uint local_12c;
  ulong local_128;
  ulong local_120;
  UInt32 local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  CLzmaProb (*local_108) [16];
  ulong local_100;
  CLzmaProb (*local_f8) [16];
  CLzmaProb *local_f0;
  ulong local_e8;
  UInt32 local_dc;
  ulong local_d8;
  UInt32 local_cc;
  CProbPrice local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8 [6];
  CLenEnc *local_a0;
  CLenEnc *local_98;
  UInt64 local_90;
  UInt32 (*local_88) [128];
  UInt32 (*local_80) [64];
  UInt32 (*local_78) [272];
  uint *local_70;
  CLenPriceEnc *local_68;
  CLzmaProb *local_60;
  CLenPriceEnc *local_58;
  Byte *local_50;
  ulong local_48;
  CLzmaProb (*local_40) [64];
  ulong local_38;
  
  local_dc = maxPackSize;
  if (p->needInit != 0) {
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->needInit = 0;
  }
  local_150 = p->result;
  if (p->finished == 0) {
    if (local_150 == 0) {
      if ((p->rc).res != 0) {
        p->result = 9;
      }
      if ((p->matchFinderBase).result != 0) {
        p->result = 8;
      }
      local_150 = p->result;
      if (local_150 != 0) {
        p->finished = 1;
      }
    }
    if (local_150 == 0) {
      UVar5 = p->nowPos64;
      local_194 = (UInt32)UVar5;
      if (UVar5 == 0) {
        UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        if (UVar8 == 0) {
          local_150 = Flush(p,local_194);
        }
        else {
          ReadMatchDistances(p,local_178);
          uVar4 = p->isMatch[0][0];
          uVar24 = ((p->rc).range >> 0xb) * (uint)uVar4;
          p->isMatch[0][0] = (short)(0x800 - uVar4 >> 5) + uVar4;
          if (uVar24 < 0x1000000) {
            uVar24 = uVar24 * 0x100;
            RangeEnc_ShiftLow(&p->rc);
          }
          (p->rc).range = uVar24;
          pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
          LitEnc_Encode(&p->rc,p->litProbs,(uint)pBVar13[-(ulong)p->additionalOffset]);
          p->additionalOffset = p->additionalOffset - 1;
          local_194 = 1;
        }
        if (UVar8 == 0) {
          return local_150;
        }
      }
      local_90 = UVar5;
      UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar8 != 0) {
        local_70 = &p->numPairs;
        local_140 = p->ProbPrices;
        local_f8 = p->isMatch;
        local_108 = p->isRep0Long;
        local_148 = (p->repLenEnc).prices;
        local_78 = (p->lenEnc).prices;
        local_80 = p->posSlotPrices;
        local_88 = p->distancesPrices;
        local_180 = &p->rc;
        local_98 = &p->lenProbs;
        local_40 = p->posSlotEncoder;
        local_60 = p->posEncoders;
        local_a0 = &p->repLenProbs;
        local_58 = &p->lenEnc;
        local_68 = &p->repLenEnc;
        local_50 = (Byte *)(ulong)local_dc;
        local_cc = maxUnpackSize;
        do {
          if (p->fastMode == 0) {
            uVar24 = p->optCur;
            if (p->optEnd != uVar24) {
              UVar8 = p->opt[uVar24].len;
              p->backRes = p->opt[uVar24].dist;
              p->optCur = uVar24 + 1;
              goto LAB_0019cf35;
            }
            p->optCur = 0;
            p->optEnd = 0;
            if (p->additionalOffset == 0) {
              uVar24 = ReadMatchDistances(p,&local_18c);
            }
            else {
              uVar24 = p->longestMatchLen;
              local_18c = p->numPairs;
            }
            uVar40 = p->numAvail;
            if (uVar40 < 2) {
              p->backRes = 0xffffffff;
              bVar43 = false;
              UVar8 = 1;
            }
            else {
              uVar20 = 0x111;
              if (uVar40 < 0x111) {
                uVar20 = uVar40;
              }
              pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              bVar3 = pBVar13[-1];
              if (uVar20 < 4) {
                uVar20 = 3;
              }
              lVar16 = 0;
              uVar36 = 0;
              do {
                uVar21 = p->reps[lVar16];
                local_178[lVar16] = uVar21;
                uVar41 = local_178[0];
                if ((bVar3 == pBVar13[~(ulong)uVar21]) &&
                   (lVar33 = -(ulong)uVar21, *pBVar13 == pBVar13[lVar33])) {
                  uVar25 = 2;
                  if (uVar40 != 2) {
                    uVar12 = 2;
                    do {
                      in_R8 = (COptimal *)CONCAT71((int7)((ulong)in_R8 >> 8),pBVar13[uVar12 - 1]);
                      uVar25 = uVar12;
                      if (pBVar13[uVar12 - 1] != pBVar13[uVar12 + lVar33 + -1]) break;
                      uVar12 = uVar12 + 1;
                      uVar25 = (ulong)uVar20;
                    } while (uVar20 != uVar12);
                  }
                  uVar21 = (uint)uVar25;
                  local_b8[lVar16] = uVar21;
                  if (local_b8[uVar36] < uVar21) {
                    uVar36 = (uint)lVar16;
                  }
                  bVar43 = uVar21 == 0x111;
                }
                else {
                  local_b8[lVar16] = 0;
                  bVar43 = false;
                }
              } while ((!bVar43) && (lVar16 = lVar16 + 1, lVar16 != 4));
              UVar8 = local_b8[uVar36];
              if (UVar8 < p->numFastBytes) {
                if (uVar24 < p->numFastBytes) {
                  bVar19 = pBVar13[~(ulong)local_178[0]];
                  if (UVar8 <= uVar24) {
                    UVar8 = uVar24;
                  }
                  in_R8 = (COptimal *)(ulong)UVar8;
                  if ((UVar8 < 2) && (bVar3 != bVar19)) {
                    p->backRes = 0xffffffff;
                    bVar43 = false;
                  }
                  else {
                    uVar12 = (ulong)p->state;
                    p->opt[0].state = (CState)p->state;
                    uVar25 = (ulong)(p->pbMask & local_194);
                    local_160 = local_f8 + uVar12;
                    local_168 = (Byte *)CONCAT44(local_168._4_4_,
                                                 p->ProbPrices[(*local_160)[uVar25] >> 4]);
                    if (uVar12 < 7) {
                      UVar35 = 0;
                      uVar40 = bVar3 + 0x100;
                      do {
                        UVar35 = UVar35 + local_140[(-(uVar40 & 1) & 0x7f0 ^
                                                    (uint)*(ushort *)
                                                           ((long)(p->litProbs +
                                                                  ((((uint)pBVar13[-2] |
                                                                    local_194 << 8) & p->lpMask) <<
                                                                  ((byte)p->lc & 0x1f)) * 3) +
                                                           (ulong)(uVar40 & 0xfffffffe))) >> 4];
                        bVar43 = 3 < uVar40;
                        uVar40 = uVar40 >> 1;
                      } while (bVar43);
                    }
                    else {
                      local_188 = (Byte *)CONCAT71(local_188._1_7_,bVar19);
                      UVar35 = LitEnc_Matched_GetPrice
                                         (p->litProbs +
                                          ((((uint)pBVar13[-2] | local_194 << 8) & p->lpMask) <<
                                          ((byte)p->lc & 0x1f)) * 3,(uint)bVar3,(uint)bVar19,
                                          local_140);
                      bVar19 = (byte)local_188;
                    }
                    p->opt[1].price = UVar35 + (int)local_168;
                    p->opt[1].dist = 0xffffffff;
                    p->opt[1].extra = 0;
                    iVar37 = *(int *)((long)p->ProbPrices +
                                     (ulong)((*local_160)[uVar25] >> 2 & 0xfffffffc ^ 0x1fc));
                    iVar15 = *(int *)((long)p->ProbPrices +
                                     (ulong)(p->isRep[uVar12] >> 2 & 0xfffffffc ^ 0x1fc)) + iVar37;
                    if (local_b8[0] == 0 && bVar3 == bVar19) {
                      uVar40 = p->ProbPrices[p->isRepG0[uVar12] >> 4] + iVar15 +
                               p->ProbPrices[local_108[uVar12][uVar25] >> 4];
                      if (uVar40 < UVar35 + (int)local_168) {
                        p->opt[1].price = uVar40;
                        p->opt[1].dist = 0;
                        p->opt[1].extra = 0;
                      }
                      if (UVar8 < 2) {
                        p->backRes = p->opt[1].dist;
                        bVar43 = false;
                        UVar8 = 1;
                        goto LAB_0019bf36;
                      }
                    }
                    p->opt[1].len = 1;
                    p->opt[0].reps[0] = uVar41;
                    p->opt[0].reps[1] = local_178[1];
                    p->opt[0].reps[2] = local_178[2];
                    p->opt[0].reps[3] = local_16c;
                    lVar16 = 0;
                    do {
                      uVar40 = local_b8[lVar16];
                      if (1 < uVar40) {
                        uVar20 = (uint)(p->isRepG0[uVar12] >> 4);
                        if (lVar16 == 0) {
                          CVar32 = *(CProbPrice *)
                                    ((long)local_140 +
                                    (ulong)(local_108[uVar12][uVar25] >> 2 & 0xfffffffc ^ 0x1fc));
LAB_0019dd39:
                          iVar31 = CVar32 + local_140[uVar20];
                        }
                        else {
                          CVar32 = p->ProbPrices[uVar20 ^ 0x7f];
                          uVar20 = (uint)(p->isRepG1[uVar12] >> 4);
                          if (lVar16 == 1) goto LAB_0019dd39;
                          iVar31 = CVar32 + p->ProbPrices[uVar20 ^ 0x7f] +
                                   p->ProbPrices
                                   [(2 - (UInt32)lVar16 & 0x7f0 ^ (uint)p->isRepG2[uVar12]) >> 4];
                        }
                        do {
                          uVar20 = local_148[uVar25 - 1][(ulong)uVar40 + 0x10e] + iVar31 + iVar15;
                          if (uVar20 < p->opt[uVar40].price) {
                            pCVar23 = p->opt + uVar40;
                            pCVar23->price = uVar20;
                            pCVar23->len = uVar40;
                            pCVar23->dist = (UInt32)lVar16;
                            pCVar23->extra = 0;
                          }
                          uVar40 = uVar40 - 1;
                        } while (1 < uVar40);
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    uVar40 = local_b8[0] + 1;
                    bVar43 = true;
                    if (uVar24 < uVar40) {
                      UVar8 = 1;
                      goto LAB_0019bf36;
                    }
                    if (uVar40 < 2) {
                      uVar40 = 2;
                      uVar22 = 0;
                    }
                    else {
                      uVar22 = 0xfffffffe;
                      do {
                        uVar22 = (ulong)((int)uVar22 + 2);
                      } while (p->matches[uVar22] < uVar40);
                    }
                    CVar32 = p->ProbPrices[p->isRep[uVar12] >> 4];
                    while( true ) {
                      uVar20 = p->matches[uVar22 + 1];
                      iVar15 = local_78[uVar25 - 1][(ulong)uVar40 + 0x10e] + iVar37 + CVar32;
                      uVar24 = uVar40 - 2;
                      if (4 < uVar40) {
                        uVar24 = 3;
                      }
                      if ((ulong)uVar20 < 0x80) {
                        uVar24 = iVar15 + local_88[uVar24][uVar20];
                      }
                      else {
                        iVar31 = 6;
                        if (0xfffff < uVar20) {
                          iVar31 = 0x13;
                        }
                        uVar24 = iVar15 + p->alignPrices[uVar20 & 0xf] +
                                 local_80[uVar24]
                                 [(uint)p->g_FastPos[uVar20 >> (sbyte)iVar31] + iVar31 * 2];
                      }
                      if (uVar24 < p->opt[uVar40].price) {
                        pCVar23 = p->opt + uVar40;
                        pCVar23->price = uVar24;
                        pCVar23->len = uVar40;
                        pCVar23->dist = uVar20 + 4;
                        pCVar23->extra = 0;
                      }
                      uVar24 = (int)uVar22 + 2;
                      if ((uVar40 == p->matches[uVar22]) && (uVar24 == local_18c)) break;
                      if (uVar40 == p->matches[uVar22]) {
                        uVar22 = (ulong)uVar24;
                      }
                      uVar40 = uVar40 + 1;
                    }
                  }
                  UVar8 = 1;
                }
                else {
                  p->backRes = p->matches[(ulong)local_18c - 1] + 4;
                  p->additionalOffset = p->additionalOffset + (uVar24 - 1);
                  (*(p->matchFinder).Skip)(p->matchFinderObj,uVar24 - 1);
                  bVar43 = false;
                  UVar8 = uVar24;
                }
              }
              else {
                p->backRes = uVar36;
                p->additionalOffset = p->additionalOffset + (UVar8 - 1);
                (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8 - 1);
                bVar43 = false;
              }
            }
LAB_0019bf36:
            if (bVar43) {
              local_10c = local_178[0];
              local_114 = local_178[1];
              local_110 = local_178[2];
              uVar25 = 0;
              local_118 = local_16c;
              local_1a8 = (ulong)local_194;
              do {
                iVar37 = (int)uVar25;
                uVar24 = iVar37 + 1;
                uVar25 = (ulong)uVar24;
                bVar43 = true;
                uVar40 = (uint)in_R8;
                if (uVar24 != uVar40) {
                  if (uVar24 < 0x7c0) {
                    local_158 = uVar25;
                    uVar24 = ReadMatchDistances(p,&local_18c);
                    if (uVar24 < p->numFastBytes) {
                      uVar25 = local_158 & 0xffffffff;
                      pCVar23 = p->opt + uVar25;
                      UVar8 = p->opt[uVar25].len;
                      uVar20 = (int)local_158 - UVar8;
                      if (UVar8 == 1) {
                        if (pCVar23->dist == 0) {
                          pBVar13 = "\t\t\t\t\t\t\t\v\v\v\v\v";
                        }
                        else {
                          pBVar13 = "";
                        }
                        uVar21 = (uint)pBVar13[p->opt[uVar20].state];
                        uVar36 = local_10c;
                      }
                      else {
                        uVar36 = pCVar23->dist;
                        uVar12 = (ulong)uVar36;
                        uVar4 = pCVar23->extra;
                        if (uVar4 == 0) {
                          if (uVar36 < 4) {
                            pBVar13 = "\b\b\b\b\b\b\b\v\v\v\v\v";
                          }
                          else {
                            pBVar13 = "\a\a\a\a\a\a\a\n\n\n\n\n";
                          }
                          uVar21 = (uint)pBVar13[p->opt[uVar20].state];
                        }
                        else {
                          uVar20 = uVar20 - uVar4;
                          uVar21 = 8;
                          if (uVar4 == 1) {
                            uVar21 = (uVar36 < 4) + 7;
                          }
                        }
                        local_178[1] = p->opt[uVar20].reps[0];
                        local_114 = local_178[1];
                        if (uVar36 < 4) {
                          if (uVar12 == 0) {
                            local_114 = p->opt[uVar20].reps[1];
                            local_110 = p->opt[uVar20].reps[2];
                            local_118 = p->opt[uVar20].reps[3];
                            uVar36 = local_178[1];
                            local_178[0] = local_178[1];
                            local_178[1] = local_114;
                            local_178[2] = local_110;
                            local_16c = local_118;
                          }
                          else {
                            local_178[2] = p->opt[uVar20].reps[1];
                            if (uVar36 == 1) {
                              local_110 = p->opt[uVar20].reps[2];
                              local_118 = p->opt[uVar20].reps[3];
                              uVar36 = local_178[2];
                              local_178[0] = local_178[2];
                              local_178[2] = local_110;
                              local_16c = local_118;
                            }
                            else {
                              uVar36 = p->opt[uVar20].reps[uVar12];
                              local_118 = p->opt[uVar20].reps[uVar12 ^ 1];
                              local_110 = local_178[2];
                              local_178[0] = uVar36;
                              local_16c = local_118;
                            }
                          }
                        }
                        else {
                          uVar36 = uVar36 - 3;
                          local_110 = p->opt[uVar20].reps[1];
                          local_118 = p->opt[uVar20].reps[2];
                          local_178[0] = uVar36;
                          local_178[2] = local_110;
                          local_16c = local_118;
                        }
                      }
                      uVar41 = (int)local_1a8 + 1;
                      uVar22 = (ulong)uVar41;
                      pCVar23->state = (CState)uVar21;
                      pCVar23->reps[0] = uVar36;
                      pCVar23->reps[1] = local_114;
                      pCVar23->reps[2] = local_110;
                      pCVar23->reps[3] = local_118;
                      local_bc = uVar24;
                      local_188 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                      local_168 = local_188 + -1;
                      bVar3 = local_188[-1];
                      local_d8 = (ulong)uVar36;
                      bVar19 = local_168[-local_d8];
                      local_14c = p->pbMask;
                      local_160 = (CLzmaProb (*) [16])(ulong)(local_14c & uVar41);
                      uVar12 = (ulong)uVar21;
                      uVar20 = local_f8[uVar12][(long)local_160] >> 2 & 0xfffffffc;
                      local_12c = *(int *)((long)p->ProbPrices + (ulong)(uVar20 ^ 0x1fc)) +
                                  pCVar23->price;
                      pCVar27 = p->opt + uVar25 + 1;
                      uVar24 = pCVar27->price;
                      local_120 = CONCAT71(local_120._1_7_,bVar19);
                      local_f0 = (CLzmaProb *)((ulong)local_f0 & 0xffffffff00000000);
                      local_128 = uVar12;
                      local_10c = uVar36;
                      local_100 = uVar22;
                      if ((uVar24 < 0x40000000 && bVar19 == bVar3) ||
                         (uVar20 = pCVar23->price + *(int *)((long)p->ProbPrices + (ulong)uVar20),
                         uVar24 < uVar20)) {
                        uVar20 = 0;
                      }
                      else {
                        if (uVar21 < 7) {
                          UVar8 = 0;
                          uVar36 = bVar3 | 0x100;
                          do {
                            UVar8 = UVar8 + local_140[(-(uVar36 & 1) & 0x7f0 ^
                                                      (uint)*(ushort *)
                                                             ((long)(p->litProbs +
                                                                    ((((uint)local_188[-2] |
                                                                      uVar41 * 0x100) & p->lpMask)
                                                                    << ((byte)p->lc & 0x1f)) * 3) +
                                                             (ulong)(uVar36 & 0xfffffffe))) >> 4];
                            bVar43 = 3 < uVar36;
                            uVar36 = uVar36 >> 1;
                          } while (bVar43);
                        }
                        else {
                          UVar8 = LitEnc_Matched_GetPrice
                                            (p->litProbs +
                                             ((((uint)local_188[-2] | uVar41 * 0x100) & p->lpMask)
                                             << ((byte)p->lc & 0x1f)) * 3,(uint)bVar3,(uint)bVar19,
                                             local_140);
                        }
                        uVar20 = UVar8 + uVar20;
                        if (uVar20 < uVar24) {
                          pCVar27->price = uVar20;
                          p->opt[uVar25 + 1].len = 1;
                          p->opt[uVar25 + 1].dist = 0xffffffff;
                          p->opt[uVar25 + 1].extra = 0;
                          local_f0 = (CLzmaProb *)CONCAT44(local_f0._4_4_,1);
                        }
                      }
                      pCVar23 = (COptimal *)((ulong)in_R8 & 0xffffffff);
                      uVar36 = *(int *)((long)p->ProbPrices +
                                       (ulong)(p->isRep[local_128] >> 2 & 0xfffffffc ^ 0x1fc)) +
                               local_12c;
                      local_138 = CONCAT44(local_138._4_4_,uVar36);
                      local_c0 = p->numAvail;
                      local_c4 = 0x7fe - iVar37;
                      uVar24 = local_c4;
                      if (local_c0 < local_c4) {
                        uVar24 = local_c0;
                      }
                      if ((((((uint)local_128 < 7) && ((byte)local_120 == bVar3)) &&
                           (uVar36 < pCVar27->price)) &&
                          ((p->opt[uVar25 + 1].len < 2 || (p->opt[uVar25 + 1].dist != 0)))) &&
                         (uVar36 = p->ProbPrices[p->isRepG0[local_128] >> 4] + uVar36 +
                                   p->ProbPrices[local_108[uVar12][(long)local_160] >> 4],
                         uVar36 < pCVar27->price)) {
                        pCVar27->price = uVar36;
                        p->opt[uVar25 + 1].len = 1;
                        p->opt[uVar25 + 1].dist = 0;
                        p->opt[uVar25 + 1].extra = 0;
                        local_f0 = (CLzmaProb *)((ulong)local_f0 & 0xffffffff00000000);
                      }
                      uVar25 = local_158;
                      if (1 < uVar24) {
                        uVar36 = p->numFastBytes;
                        local_e8 = (ulong)uVar36;
                        uVar21 = uVar36;
                        if (uVar24 < uVar36) {
                          uVar21 = uVar24;
                        }
                        if (((uVar20 != 0 && (char)local_f0 == '\0') && ((byte)local_120 != bVar3))
                           && ((uVar24 != 2 &&
                               ((lVar16 = -local_d8, *local_188 == local_188[lVar16] &&
                                (local_188[1] == local_188[lVar16 + 1])))))) {
                          uVar41 = uVar36 + 1;
                          if (uVar24 <= uVar36 + 1) {
                            uVar41 = uVar24;
                          }
                          uVar22 = 3;
                          if (3 < uVar41) {
                            uVar17 = 3;
                            do {
                              uVar22 = uVar17;
                              if (local_188[uVar17 - 1] != local_188[uVar17 + lVar16 + -1]) break;
                              uVar17 = uVar17 + 1;
                              uVar22 = (ulong)uVar41;
                            } while (uVar41 != uVar17);
                          }
                          bVar3 = ""[local_128];
                          uVar17 = (ulong)((int)local_1a8 + 2U & local_14c);
                          uVar36 = (int)local_158 + (int)uVar22;
                          pCVar27 = (COptimal *)(ulong)uVar36;
                          pCVar23 = (COptimal *)((ulong)in_R8 & 0xffffffff);
                          if (uVar40 <= uVar36) {
                            pCVar23 = pCVar27;
                          }
                          uVar36 = (int)uVar22 - 1;
                          uVar40 = uVar20 + *(int *)((long)p->ProbPrices +
                                                    (ulong)(local_f8[bVar3][uVar17] >> 2 &
                                                            0xfffffffc ^ 0x1fc)) +
                                   *(int *)((long)p->ProbPrices +
                                           (ulong)(local_108[bVar3][uVar17] >> 2 & 0xfffffffc ^
                                                  0x1fc)) +
                                   *(int *)((long)p->ProbPrices +
                                           (ulong)(p->isRep[bVar3] >> 2 & 0xfffffffc ^ 0x1fc)) +
                                   p->ProbPrices[p->isRepG0[bVar3] >> 4] +
                                   local_148[uVar17 - 1][(ulong)uVar36 + 0x10e];
                          if (uVar40 < p->opt[(long)pCVar27].price) {
                            pCVar27 = p->opt + (long)pCVar27;
                            pCVar27->price = uVar40;
                            pCVar27->len = uVar36;
                            pCVar27->dist = 0;
                            pCVar27->extra = 1;
                          }
                        }
                        local_f0 = local_108[uVar12] + (long)local_160;
                        local_1a8 = 2;
                        lVar16 = 0;
                        pBVar13 = local_168;
                        in_R8 = pCVar23;
                        paUVar34 = local_148;
                        pBVar38 = local_188;
                        local_120 = (ulong)uVar21;
                        do {
                          pBVar11 = pBVar13 + -(ulong)local_178[lVar16];
                          if ((*pBVar13 == *pBVar11) && (*pBVar38 == pBVar11[1])) {
                            lVar33 = -(ulong)local_178[lVar16];
                            uVar12 = 2;
                            if (2 < uVar21) {
                              uVar22 = 2;
                              do {
                                uVar12 = uVar22;
                                if (pBVar38[uVar22 - 1] != pBVar38[uVar22 + lVar33 + -1]) break;
                                uVar22 = uVar22 + 1;
                                uVar12 = (ulong)uVar21;
                              } while (local_120 != uVar22);
                            }
                            uVar40 = (uint)uVar12;
                            uVar20 = (int)uVar25 + uVar40;
                            if (uVar20 < (uint)in_R8) {
                              uVar20 = (uint)in_R8;
                            }
                            uVar36 = (uint)(p->isRepG0[local_128] >> 4);
                            UVar8 = (UInt32)lVar16;
                            if (lVar16 == 0) {
                              iVar37 = *(int *)((long)local_140 +
                                               (ulong)(*local_f0 >> 2 & 0xfffffffc ^ 0x1fc)) +
                                       local_140[uVar36];
                            }
                            else {
                              uVar41 = (uint)(p->isRepG1[local_128] >> 4);
                              if (lVar16 == 1) {
                                iVar37 = p->ProbPrices[uVar36 ^ 0x7f] + local_140[uVar41];
                              }
                              else {
                                iVar37 = p->ProbPrices[uVar36 ^ 0x7f] + p->ProbPrices[uVar41 ^ 0x7f]
                                         + p->ProbPrices
                                           [(2 - UVar8 & 0x7f0 ^ (uint)p->isRepG2[local_128]) >> 4];
                              }
                            }
                            iVar37 = iVar37 + (int)local_138;
                            uVar22 = uVar12 & 0xffffffff;
                            do {
                              UVar35 = (UInt32)uVar22;
                              uVar36 = paUVar34[(long)((long)(local_160 + -1) + 0x1f)]
                                       [uVar22 + 0x10e] + iVar37;
                              uVar41 = (int)uVar25 + UVar35;
                              if (uVar36 < p->opt[uVar41].price) {
                                pCVar23 = p->opt + uVar41;
                                pCVar23->price = uVar36;
                                pCVar23->len = UVar35;
                                pCVar23->dist = UVar8;
                                pCVar23->extra = 0;
                              }
                              uVar22 = (ulong)(UVar35 - 1);
                            } while (1 < UVar35 - 1);
                            uVar12 = uVar12 & 0xffffffff;
                            uVar22 = uVar12 + 1;
                            if (lVar16 == 0) {
                              local_1a8 = uVar22;
                            }
                            local_1a8 = local_1a8 & 0xffffffff;
                            uVar36 = (int)uVar22 + (int)local_e8;
                            if (uVar24 <= uVar36) {
                              uVar36 = uVar24;
                            }
                            uVar41 = uVar40 + 3;
                            uVar17 = (ulong)uVar41;
                            if (((uVar41 <= uVar36) && (local_168[uVar22] == pBVar11[uVar22])) &&
                               (local_168[uVar12 + 2] == pBVar11[uVar12 + 2])) {
                              uVar26 = (int)local_100 + uVar40;
                              local_38 = (ulong)(uVar26 & local_14c);
                              local_d8 = CONCAT44(local_d8._4_4_,
                                                  paUVar34[(long)((long)(local_160 + -1) + 0x1f)]
                                                  [uVar12 + 0x10e]);
                              local_c8 = p->ProbPrices
                                         [local_f8["\b\b\b\b\b\b\b\v\v\v\v\v"[local_128]][local_38]
                                          >> 4];
                              local_48 = uVar22;
                              UVar35 = LitEnc_Matched_GetPrice
                                                 (p->litProbs +
                                                  ((((uint)local_168[uVar12 - 1] | uVar26 * 0x100) &
                                                   p->lpMask) << ((byte)p->lc & 0x1f)) * 3,
                                                  (uint)local_168[uVar12],(uint)pBVar11[uVar12],
                                                  local_140);
                              if (uVar41 < uVar36) {
                                pBVar13 = local_168 + uVar17;
                                do {
                                  uVar41 = (uint)uVar17;
                                  if (*pBVar13 != pBVar13[lVar33]) break;
                                  uVar26 = (uint)uVar17 + 1;
                                  uVar17 = (ulong)uVar26;
                                  pBVar13 = pBVar13 + 1;
                                  uVar41 = uVar36;
                                } while (uVar36 != uVar26);
                              }
                              uVar25 = (ulong)((int)local_38 + 1U & local_14c);
                              uVar36 = uVar41 + (int)local_158;
                              if (uVar20 <= uVar36) {
                                uVar20 = uVar36;
                              }
                              uVar26 = (int)local_d8 + iVar37 + local_c8 + UVar35 +
                                       *(int *)((long)p->ProbPrices +
                                               (ulong)(p->isMatch[5][uVar25] >> 2 & 0xfffffffc ^
                                                      0x1fc)) +
                                       *(int *)((long)p->ProbPrices +
                                               (ulong)(p->isRep0Long[5][uVar25] >> 2 & 0xfffffffc ^
                                                      0x1fc)) +
                                       *(int *)((long)p->ProbPrices +
                                               (ulong)(p->isRep[5] >> 2 & 0xfffffffc ^ 0x1fc)) +
                                       p->ProbPrices[p->isRepG0[5] >> 4] +
                                       local_148[uVar25 - 1][(ulong)(~uVar40 + uVar41) + 0x10e];
                              uVar25 = local_158;
                              if (uVar26 < p->opt[uVar36].price) {
                                pCVar23 = p->opt + uVar36;
                                pCVar23->price = uVar26;
                                pCVar23->len = ~uVar40 + uVar41;
                                pCVar23->extra = (CExtra)local_48;
                                pCVar23->dist = UVar8;
                              }
                            }
                            in_R8 = (COptimal *)(ulong)uVar20;
                            pBVar13 = local_168;
                            paUVar34 = local_148;
                            pBVar38 = local_188;
                          }
                          lVar16 = lVar16 + 1;
                        } while (lVar16 != 4);
                        uVar40 = local_bc;
                        if (uVar21 < local_bc) {
                          uVar12 = 0xfffffffe;
                          do {
                            iVar37 = (int)uVar12;
                            uVar12 = (ulong)(iVar37 + 2);
                          } while (p->matches[uVar12] < uVar21);
                          p->matches[uVar12] = uVar21;
                          local_18c = iVar37 + 4;
                          uVar40 = uVar21;
                        }
                        uVar20 = (uint)local_1a8;
                        pCVar23 = in_R8;
                        if (uVar20 <= uVar40) {
                          uVar12 = 0xfffffffe;
                          do {
                            uVar12 = (ulong)((int)uVar12 + 2);
                          } while (p->matches[uVar12] < uVar20);
                          uVar40 = uVar40 + (int)uVar25;
                          iVar37 = p->ProbPrices[p->isRep[local_128] >> 4] + local_12c;
                          if ((uint)in_R8 <= uVar40) {
                            in_R8 = (COptimal *)(ulong)uVar40;
                          }
                          uVar22 = (ulong)p->matches[uVar12 + 1];
                          iVar15 = 0x13;
                          if (uVar22 < 0x100000) {
                            iVar15 = 6;
                          }
                          local_e8 = CONCAT44(local_e8._4_4_,
                                              (uint)p->g_FastPos
                                                    [p->matches[uVar12 + 1] >> (sbyte)iVar15] +
                                              iVar15 * 2);
                          local_188 = pBVar38 + -2;
                          local_120 = CONCAT44(local_120._4_4_,local_18c);
                          uVar20 = uVar20 + 3;
                          pBVar13 = local_188;
                          do {
                            uVar40 = (uint)local_1a8;
                            uVar17 = (ulong)(uVar40 - 2);
                            if (2 < uVar40 - 2) {
                              uVar17 = 3;
                            }
                            uVar36 = (uint)uVar22;
                            uVar18 = uVar22 & 0xffffffff;
                            if (uVar36 < 0x80) {
                              UVar8 = local_88[uVar17][uVar18];
                            }
                            else {
                              UVar8 = p->alignPrices[uVar36 & 0xf] +
                                      local_80[uVar17][local_e8 & 0xffffffff];
                            }
                            uVar41 = local_78[(long)((long)(local_160 + -1) + 0x1f)]
                                     [local_1a8 + 0x10e] + iVar37 + UVar8;
                            uVar21 = uVar40 + (int)uVar25;
                            if (uVar41 < p->opt[uVar21].price) {
                              pCVar23 = p->opt + uVar21;
                              pCVar23->price = uVar41;
                              pCVar23->len = uVar40;
                              pCVar23->dist = uVar36 + 4;
                              pCVar23->extra = 0;
                            }
                            uVar17 = (ulong)uVar20;
                            pBVar38 = pBVar13;
                            if (uVar40 == p->matches[uVar12]) {
                              uVar36 = p->numFastBytes + uVar40 + 1;
                              if (uVar24 <= uVar36) {
                                uVar36 = uVar24;
                              }
                              uVar21 = uVar40 + 3;
                              local_138 = uVar22;
                              if (uVar21 <= uVar36) {
                                local_12c = uVar40 + 1;
                                pBVar38 = local_188;
                                if ((local_168[local_12c] == pBVar13[local_12c - uVar18]) &&
                                   (local_168[uVar40 + 2] == pBVar13[(uVar40 + 2) - uVar18])) {
                                  uVar25 = (ulong)uVar21;
                                  if (uVar21 < uVar36) {
                                    uVar21 = p->numFastBytes + uVar40 + 1;
                                    if (local_c0 < uVar21) {
                                      uVar21 = local_c0;
                                    }
                                    if (local_c4 <= uVar21) {
                                      uVar21 = local_c4;
                                    }
                                    do {
                                      uVar25 = uVar17;
                                      if (local_168[uVar17] != pBVar13[uVar17 - uVar18]) break;
                                      uVar17 = uVar17 + 1;
                                      uVar25 = (ulong)uVar21;
                                    } while (uVar17 < uVar36);
                                  }
                                  uVar36 = (int)local_100 + uVar40;
                                  local_14c = p->pbMask;
                                  uVar21 = local_14c & uVar36;
                                  CVar32 = p->ProbPrices
                                           [local_f8["\a\a\a\a\a\a\a\n\n\n\n\n"[local_128]][uVar21]
                                            >> 4];
                                  UVar8 = LitEnc_Matched_GetPrice
                                                    (p->litProbs +
                                                     ((((uint)local_168[local_1a8 - 1] |
                                                       uVar36 * 0x100) & p->lpMask) <<
                                                     ((byte)p->lc & 0x1f)) * 3,
                                                     (uint)local_168[local_1a8],
                                                     (uint)pBVar13[local_1a8 - uVar18],local_140);
                                  uVar22 = (ulong)(uVar21 + 1 & local_14c);
                                  uVar21 = (int)local_158 + (int)uVar25;
                                  uVar36 = (uint)in_R8;
                                  if ((uint)in_R8 <= uVar21) {
                                    uVar36 = uVar21;
                                  }
                                  in_R8 = (COptimal *)(ulong)uVar36;
                                  uVar26 = ~uVar40 + (int)uVar25;
                                  uVar36 = UVar8 + uVar41 + CVar32 +
                                           *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isMatch[4][uVar22] >> 2 & 0xfffffffc ^
                                                          0x1fc)) +
                                           *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isRep0Long[4][uVar22] >> 2 &
                                                           0xfffffffc ^ 0x1fc)) +
                                           *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isRep[4] >> 2 & 0xfffffffc ^ 0x1fc)) +
                                           p->ProbPrices[p->isRepG0[4] >> 4] +
                                           local_148[uVar22 - 1][(ulong)uVar26 + 0x10e];
                                  uVar25 = local_158;
                                  pBVar38 = local_188;
                                  if (uVar36 < p->opt[uVar21].price) {
                                    pCVar23 = p->opt + uVar21;
                                    pCVar23->price = uVar36;
                                    pCVar23->len = uVar26;
                                    pCVar23->extra = (CExtra)local_12c;
                                    pCVar23->dist = (int)local_138 + 4;
                                  }
                                }
                              }
                              uVar36 = (int)uVar12 + 2;
                              uVar12 = (ulong)uVar36;
                              bVar44 = uVar36 != (uint)local_120;
                              uVar22 = local_138;
                              if (bVar44) {
                                uVar22 = (ulong)p->matches[(ulong)uVar36 + 1];
                                iVar15 = 0x13;
                                if (uVar22 < 0x100000) {
                                  iVar15 = 6;
                                }
                                local_e8 = CONCAT44(local_e8._4_4_,
                                                    (uint)p->g_FastPos
                                                          [p->matches[(ulong)uVar36 + 1] >>
                                                           (sbyte)iVar15] + iVar15 * 2);
                                goto LAB_0019ce3f;
                              }
                            }
                            else {
LAB_0019ce3f:
                              bVar44 = true;
                            }
                            uVar20 = uVar20 + 1;
                            bVar43 = false;
                            local_1a8 = (ulong)(uVar40 + 1);
                            pBVar13 = pBVar38;
                          } while (bVar44);
                          local_1a8 = local_100;
                          uVar25 = uVar25 & 0xffffffff;
                          goto LAB_0019ce6a;
                        }
                      }
                      in_R8 = pCVar23;
                      bVar43 = false;
                      local_1a8 = local_100;
                      uVar25 = uVar25 & 0xffffffff;
                    }
                    else {
                      p->numPairs = local_18c;
                      p->longestMatchLen = uVar24;
                      in_R8 = (COptimal *)((ulong)in_R8 & 0xffffffff);
                      uVar25 = local_158;
                    }
                  }
                  else {
                    uVar20 = iVar37 + 2;
                    if (uVar20 <= uVar40) {
                      uVar36 = p->opt[uVar25].price;
                      do {
                        uVar21 = p->opt[uVar20].price;
                        if (uVar21 <= uVar36) {
                          uVar25 = (ulong)uVar20;
                          uVar36 = uVar21;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar20 <= uVar40);
                    }
                    UVar8 = (int)uVar25 - uVar24;
                    if (UVar8 != 0) {
                      p->additionalOffset = p->additionalOffset + UVar8;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
                      in_R8 = (COptimal *)((ulong)in_R8 & 0xffffffff);
                    }
                  }
                }
LAB_0019ce6a:
              } while (!bVar43);
              do {
                p->opt[(ulong)in_R8 & 0xffffffff].price = 0x40000000;
                uVar24 = (int)in_R8 - 1;
                in_R8 = (COptimal *)(ulong)uVar24;
              } while (uVar24 != 0);
              uVar24 = (int)uVar25 + 1;
              p->optEnd = uVar24;
              while( true ) {
                uVar12 = uVar25 & 0xffffffff;
                UVar8 = p->opt[uVar12].len;
                UVar35 = p->opt[uVar12].dist;
                uVar4 = p->opt[uVar12].extra;
                uVar40 = (int)uVar25 - UVar8;
                uVar25 = (ulong)uVar40;
                if (uVar4 != 0) {
                  uVar20 = uVar24 - 1;
                  in_R8 = p->opt + uVar20;
                  p->opt[uVar20].len = UVar8;
                  uVar36 = (uint)uVar4;
                  uVar25 = (ulong)(uVar40 - uVar36);
                  if (uVar36 == 1) {
                    in_R8->dist = UVar35;
                    UVar8 = 1;
                    UVar35 = 0xffffffff;
                    uVar24 = uVar20;
                  }
                  else {
                    in_R8->dist = 0;
                    UVar8 = uVar36 - 1;
                    uVar24 = uVar24 - 2;
                    in_R8 = (COptimal *)0xffffffff00000001;
                    p->opt[uVar24].len = 1;
                    p->opt[uVar24].dist = 0xffffffff;
                  }
                }
                if ((int)uVar25 == 0) break;
                uVar24 = uVar24 - 1;
                p->opt[uVar24].dist = UVar35;
                p->opt[uVar24].len = UVar8;
              }
              p->backRes = UVar35;
              p->optCur = uVar24;
            }
          }
          else {
            if (p->additionalOffset == 0) {
              uVar24 = ReadMatchDistances(p,local_178);
              paCVar10 = (CLzmaProb (*) [16])CONCAT44(extraout_var,uVar24);
            }
            else {
              paCVar10 = (CLzmaProb (*) [16])(ulong)p->longestMatchLen;
              local_178[0] = p->numPairs;
            }
            uVar24 = p->numAvail;
            p->backRes = 0xffffffff;
            if (uVar24 < 2) {
LAB_0019bb01:
              UVar8 = 1;
            }
            else {
              uVar40 = 0x111;
              if (uVar24 < 0x111) {
                uVar40 = uVar24;
              }
              pvVar30 = p->matchFinderObj;
              local_160 = paCVar10;
              pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(pvVar30);
              if (uVar40 < 4) {
                uVar40 = 3;
              }
              uVar25 = 0;
              in_R8 = (COptimal *)0x0;
              uVar20 = 0;
              do {
                bVar43 = false;
                if ((pBVar13[-1] == pBVar13[~(ulong)p->reps[uVar25]]) &&
                   (lVar16 = -(ulong)p->reps[uVar25], *pBVar13 == pBVar13[lVar16])) {
                  uVar12 = 2;
                  if (uVar24 != 2) {
                    uVar22 = 2;
                    do {
                      uVar12 = uVar22;
                      if (pBVar13[uVar22 - 1] != pBVar13[uVar22 + lVar16 + -1]) break;
                      uVar22 = uVar22 + 1;
                      uVar12 = (ulong)uVar40;
                    } while (uVar40 != uVar22);
                  }
                  uVar36 = (uint)uVar12;
                  if (uVar36 < p->numFastBytes) {
                    if (uVar20 < uVar36) {
                      in_R8 = (COptimal *)(uVar25 & 0xffffffff);
                      uVar20 = uVar36;
                    }
                    bVar43 = false;
                  }
                  else {
                    p->backRes = (UInt32)uVar25;
                    p->additionalOffset = p->additionalOffset + (uVar36 - 1);
                    (*(p->matchFinder).Skip)(p->matchFinderObj,uVar36 - 1);
                    bVar43 = true;
                    pvVar30 = (void *)(uVar12 & 0xffffffff);
                  }
                }
                uVar36 = (uint)pvVar30;
                UVar8 = uVar36;
                if (bVar43) goto LAB_0019cf35;
                uVar25 = uVar25 + 1;
              } while (uVar25 != 4);
              uVar40 = (uint)local_160;
              if (uVar40 < p->numFastBytes) {
                UVar35 = 0;
                paCVar10 = local_160;
                if (1 < uVar40) {
                  uVar25 = (ulong)local_178[0];
                  UVar35 = p->matches[uVar25 - 1];
                  do {
                    uVar40 = (uint)paCVar10;
                    local_178[0] = (uint)uVar25;
                    if (local_178[0] < 3) break;
                    if ((uVar40 == p->matches[uVar25 - 4] + 1) &&
                       (lVar16 = uVar25 - 3, p->matches[lVar16] < UVar35 >> 7)) {
                      uVar25 = (ulong)(local_178[0] - 2);
                      paCVar10 = (CLzmaProb (*) [16])(ulong)(uVar40 - 1);
                      bVar43 = true;
                      UVar35 = p->matches[lVar16];
                    }
                    else {
                      bVar43 = false;
                    }
                    uVar40 = (uint)paCVar10;
                    local_178[0] = (uint)uVar25;
                  } while (bVar43);
                  uVar21 = uVar40;
                  if (0x7f < UVar35) {
                    uVar21 = 1;
                  }
                  if (uVar40 != 2) {
                    uVar21 = uVar40;
                  }
                  paCVar10 = (CLzmaProb (*) [16])(ulong)uVar21;
                }
                uVar40 = (uint)paCVar10;
                if ((uVar20 < 2) ||
                   (((uVar20 + 1 < uVar40 && ((uVar20 + 2 < uVar40 || (UVar35 < 0x200)))) &&
                    ((uVar20 + 3 < uVar40 || (UVar35 < 0x8000)))))) {
                  if (uVar24 == 2) goto LAB_0019bb01;
                  UVar8 = 1;
                  if (1 < uVar40) {
                    uVar24 = ReadMatchDistances(p,local_70);
                    p->longestMatchLen = uVar24;
                    bVar43 = true;
                    UVar8 = uVar36;
                    if (1 < uVar24) {
                      uVar20 = p->matches[(ulong)p->numPairs - 1];
                      UVar8 = 1;
                      if ((uVar24 < uVar40) || (UVar35 <= uVar20)) {
                        uVar21 = uVar40 + 1;
                        in_R8 = (COptimal *)(ulong)uVar21;
                        bVar43 = false;
                        if ((uVar24 <= uVar21) &&
                           ((uVar24 != uVar21 || UVar35 < uVar20 >> 7 &&
                            (bVar42 = uVar24 + 1 < uVar40, bVar44 = UVar35 >> 7 <= uVar20,
                            bVar43 = bVar44 || (uVar40 < 3 || bVar42), UVar8 = uVar36,
                            !bVar44 && (uVar40 >= 3 && !bVar42))))) {
                          UVar8 = 1;
                        }
                      }
                      else {
                        bVar43 = false;
                      }
                    }
                    if (bVar43) {
                      pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                      in_R8 = (COptimal *)0x0;
                      do {
                        iVar37 = 0xc;
                        uVar24 = UVar8;
                        if (pBVar13[-1] == pBVar13[~(ulong)p->reps[(long)in_R8]]) {
                          lVar16 = -(ulong)p->reps[(long)in_R8];
                          iVar37 = 1;
                          if (*pBVar13 != pBVar13[lVar16]) {
                            iVar37 = 0xc;
                          }
                          if ((*pBVar13 == pBVar13[lVar16]) && (uVar24 = 1, 2 < uVar40 - 1)) {
                            lVar33 = 0;
                            do {
                              if (pBVar13[lVar33 + 1] != pBVar13[lVar33 + lVar16 + 1]) {
                                iVar37 = 0;
                                uVar24 = UVar8;
                                goto LAB_0019db11;
                              }
                              lVar33 = lVar33 + 1;
                            } while ((ulong)(uVar40 - 1) - 2 != lVar33);
                            iVar37 = 1;
                            uVar24 = 1;
                          }
                        }
LAB_0019db11:
                        UVar8 = uVar24;
                        if ((iVar37 != 0xc) && (iVar37 != 0)) goto LAB_0019cf35;
                        in_R8 = (COptimal *)((long)&in_R8->price + 1);
                      } while (in_R8 != (COptimal *)0x4);
                      p->backRes = UVar35 + 4;
                      UVar8 = uVar40;
                      if (uVar40 != 2) {
                        UVar8 = uVar40 - 2;
                        goto LAB_0019bd03;
                      }
                    }
                  }
                  goto LAB_0019cf35;
                }
                p->backRes = (UInt32)in_R8;
                UVar8 = uVar20 - 1;
                uVar40 = uVar20;
              }
              else {
                p->backRes = p->matches[(ulong)local_178[0] - 1] + 4;
                UVar8 = uVar40 - 1;
              }
LAB_0019bd03:
              p->additionalOffset = p->additionalOffset + UVar8;
              (*(p->matchFinder).Skip)(p->matchFinderObj,UVar8);
              UVar8 = uVar40;
            }
          }
LAB_0019cf35:
          uVar36 = p->pbMask & local_194;
          uVar24 = (p->rc).range;
          pCVar39 = local_f8[p->state] + uVar36;
          uVar4 = *pCVar39;
          uVar20 = (uVar24 >> 0xb) * (uint)uVar4;
          uVar40 = p->backRes;
          paCVar10 = (CLzmaProb (*) [16])(ulong)uVar40;
          if (paCVar10 == (CLzmaProb (*) [16])0xffffffff) {
            *pCVar39 = (short)(0x800 - uVar4 >> 5) + uVar4;
            if (uVar20 < 0x1000000) {
              uVar20 = uVar20 * 0x100;
              RangeEnc_ShiftLow(local_180);
            }
            (p->rc).range = uVar20;
            pBVar13 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
            pCVar6 = local_180;
            uVar24 = p->state;
            pbVar14 = pBVar13 + -(ulong)p->additionalOffset;
            pCVar39 = p->litProbs +
                      ((((uint)pbVar14[-1] | local_194 << 8) & p->lpMask) << ((byte)p->lc & 0x1f)) *
                      3;
            bVar3 = *pbVar14;
            p->state = (uint)""[uVar24];
            if ((ulong)uVar24 < 7) {
              LitEnc_Encode(local_180,pCVar39,(uint)bVar3);
            }
            else {
              UVar35 = (p->rc).range;
              uVar24 = (uint)pbVar14[-(ulong)p->reps[0]];
              uVar40 = bVar3 | 0x100;
              uVar20 = 0x100;
              do {
                uVar24 = uVar24 * 2;
                uVar36 = (uVar40 >> 8) + uVar20 + (uVar24 & uVar20);
                uVar21 = uVar40 >> 7 & 1;
                uVar4 = pCVar39[uVar36];
                uVar41 = (UVar35 >> 0xb) * (uint)uVar4;
                uVar26 = -uVar21;
                uVar28 = uVar26 & uVar41;
                pUVar1 = &(p->rc).low;
                *pUVar1 = *pUVar1 + (ulong)uVar28;
                uVar28 = (UVar35 & uVar26) - uVar28;
                in_R8 = (COptimal *)(ulong)uVar28;
                uVar21 = uVar21 - 1;
                UVar35 = (uVar41 & uVar21) + uVar28;
                pCVar39[uVar36] = (short)(((uVar21 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                if (UVar35 < 0x1000000) {
                  UVar35 = UVar35 * 0x100;
                  RangeEnc_ShiftLow(pCVar6);
                }
                uVar40 = uVar40 * 2;
                uVar20 = uVar20 & ~(uVar24 ^ uVar40);
              } while (uVar40 < 0x10000);
              pCVar6->range = UVar35;
            }
          }
          else {
            uVar24 = uVar24 - uVar20;
            pUVar1 = &(p->rc).low;
            *pUVar1 = *pUVar1 + (ulong)uVar20;
            *pCVar39 = uVar4 - (uVar4 >> 5);
            if (uVar24 < 0x1000000) {
              uVar24 = uVar24 * 0x100;
              RangeEnc_ShiftLow(local_180);
            }
            pCVar6 = local_180;
            uVar20 = p->state;
            uVar4 = p->isRep[uVar20];
            uVar21 = (uVar24 >> 0xb) * (uint)uVar4;
            if (uVar40 < 4) {
              uVar24 = uVar24 - uVar21;
              pUVar1 = &(p->rc).low;
              *pUVar1 = *pUVar1 + (ulong)uVar21;
              p->isRep[uVar20] = uVar4 - (uVar4 >> 5);
              if (uVar24 < 0x1000000) {
                uVar24 = uVar24 * 0x100;
                RangeEnc_ShiftLow(local_180);
              }
              uVar20 = p->state;
              uVar4 = p->isRepG0[uVar20];
              uVar21 = (uVar24 >> 0xb) * (uint)uVar4;
              if (paCVar10 == (CLzmaProb (*) [16])0x0) {
                p->isRepG0[uVar20] = (short)(0x800 - uVar4 >> 5) + uVar4;
                if (uVar21 < 0x1000000) {
                  uVar21 = uVar21 * 0x100;
                  RangeEnc_ShiftLow(pCVar6);
                }
                uVar24 = p->state;
                pCVar39 = local_108[uVar24] + uVar36;
                uVar4 = *pCVar39;
                uVar40 = (uVar21 >> 0xb) * (uint)uVar4;
                if (UVar8 == 1) {
                  *pCVar39 = (short)(0x800 - uVar4 >> 5) + uVar4;
                  p->state = (uint)"\t\t\t\t\t\t\t\v\v\v\v\v"[uVar24];
                  uVar21 = uVar40;
                }
                else {
                  uVar21 = uVar21 - uVar40;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar40;
                  *pCVar39 = uVar4 - (uVar4 >> 5);
                }
              }
              else {
                uVar24 = uVar24 - uVar21;
                pUVar1 = &(p->rc).low;
                *pUVar1 = *pUVar1 + (ulong)uVar21;
                p->isRepG0[uVar20] = uVar4 - (uVar4 >> 5);
                if (uVar24 < 0x1000000) {
                  uVar24 = uVar24 * 0x100;
                  RangeEnc_ShiftLow(pCVar6);
                }
                uVar20 = p->state;
                uVar4 = p->isRepG1[uVar20];
                uVar21 = (uVar24 >> 0xb) * (uint)uVar4;
                if (uVar40 == 1) {
                  p->isRepG1[uVar20] = (short)(0x800 - uVar4 >> 5) + uVar4;
                  UVar35 = p->reps[1];
                }
                else {
                  uVar24 = uVar24 - uVar21;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar21;
                  p->isRepG1[uVar20] = uVar4 - (uVar4 >> 5);
                  if (uVar24 < 0x1000000) {
                    uVar24 = uVar24 * 0x100;
                    RangeEnc_ShiftLow(pCVar6);
                  }
                  uVar20 = p->state;
                  uVar4 = p->isRepG2[uVar20];
                  uVar41 = (uVar24 >> 0xb) * (uint)uVar4;
                  if (uVar40 == 2) {
                    p->isRepG2[uVar20] = (short)(0x800 - uVar4 >> 5) + uVar4;
                    UVar35 = p->reps[2];
                    uVar21 = uVar41;
                  }
                  else {
                    uVar21 = uVar24 - uVar41;
                    pUVar1 = &(p->rc).low;
                    *pUVar1 = *pUVar1 + (ulong)uVar41;
                    p->isRepG2[uVar20] = uVar4 - (uVar4 >> 5);
                    UVar35 = p->reps[3];
                    p->reps[3] = p->reps[2];
                  }
                  p->reps[2] = p->reps[1];
                }
                p->reps[1] = p->reps[0];
                p->reps[0] = UVar35;
              }
              if (uVar21 < 0x1000000) {
                uVar21 = uVar21 << 8;
                RangeEnc_ShiftLow(pCVar6);
              }
              pCVar6->range = uVar21;
              if (UVar8 != 1) {
                LenEnc_Encode(local_a0,pCVar6,UVar8 - 2,uVar36);
                p->repLenEncCounter = p->repLenEncCounter + -1;
                p->state = (uint)"\b\b\b\b\b\b\b\v\v\v\v\v"[p->state];
              }
            }
            else {
              p->isRep[uVar20] = (short)(0x800 - uVar4 >> 5) + uVar4;
              local_160 = paCVar10;
              if (uVar21 < 0x1000000) {
                uVar21 = uVar21 * 0x100;
                RangeEnc_ShiftLow(local_180);
              }
              (p->rc).range = uVar21;
              p->state = (uint)"\a\a\a\a\a\a\a\n\n\n\n\n"[p->state];
              LenEnc_Encode(local_98,pCVar6,UVar8 - 2,uVar36);
              paCVar7 = local_40;
              p->reps[3] = p->reps[2];
              *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
              p->reps[0] = (int)local_160 - 3;
              p->matchPriceCount = p->matchPriceCount + 1;
              uVar24 = (int)local_160 - 4;
              if (uVar24 < 0x80) {
                uVar40 = (uint)p->g_FastPos[uVar24];
              }
              else {
                iVar37 = 0x13;
                if (uVar24 < 0x100000) {
                  iVar37 = 6;
                }
                uVar40 = (uint)p->g_FastPos[uVar24 >> (sbyte)iVar37] + iVar37 * 2;
              }
              uVar20 = uVar40 + 0x40;
              uVar36 = pCVar6->range;
              uVar21 = UVar8 - 2;
              if (4 < UVar8) {
                uVar21 = 3;
              }
              do {
                uVar25 = (ulong)(uVar20 >> 5 & 0x7fffffe);
                uVar41 = uVar20 >> 5 & 1;
                uVar4 = *(ushort *)((long)paCVar7[uVar21] + uVar25);
                uVar26 = (uVar36 >> 0xb) * (uint)uVar4;
                uVar28 = -uVar41;
                uVar29 = uVar28 & uVar26;
                pUVar1 = &(p->rc).low;
                *pUVar1 = *pUVar1 + (ulong)uVar29;
                uVar29 = (uVar36 & uVar28) - uVar29;
                in_R8 = (COptimal *)(ulong)uVar29;
                uVar41 = uVar41 - 1;
                uVar36 = (uVar26 & uVar41) + uVar29;
                *(ushort *)((long)paCVar7[uVar21] + uVar25) =
                     (short)(((uVar41 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                if (uVar36 < 0x1000000) {
                  uVar36 = uVar36 * 0x100;
                  RangeEnc_ShiftLow(pCVar6);
                }
                pCVar39 = local_60;
                uVar20 = uVar20 * 2;
              } while (uVar20 < 0x1000);
              pCVar6->range = uVar36;
              if (3 < uVar24) {
                if (uVar24 < 0x80) {
                  iVar37 = (uVar40 >> 1) - 1;
                  uVar20 = (uVar40 & 1 | 2) << ((byte)iVar37 & 0x1f);
                  uVar40 = 1;
                  do {
                    uVar41 = uVar24 & 1;
                    uVar4 = pCVar39[(ulong)uVar20 + (ulong)uVar40];
                    uVar21 = (uVar36 >> 0xb) * (uint)uVar4;
                    uVar26 = -uVar41 & uVar21;
                    pUVar1 = &(p->rc).low;
                    *pUVar1 = *pUVar1 + (ulong)uVar26;
                    uVar36 = (uVar21 & uVar41 - 1) + ((uVar36 & -uVar41) - uVar26);
                    pCVar39[(ulong)uVar20 + (ulong)uVar40] =
                         (short)(((uVar41 - 1 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                    if (uVar36 < 0x1000000) {
                      uVar36 = uVar36 * 0x100;
                      RangeEnc_ShiftLow(local_180);
                    }
                    uVar24 = uVar24 >> 1;
                    uVar40 = uVar41 + uVar40 * 2;
                    iVar37 = iVar37 + -1;
                  } while (iVar37 != 0);
                  local_180->range = uVar36;
                }
                else {
                  iVar37 = (uVar24 | 0xf) << (0x21U - (char)(uVar40 >> 1) & 0x1f);
                  do {
                    uVar40 = uVar36 >> 1;
                    pUVar1 = &(p->rc).low;
                    *pUVar1 = *pUVar1 + (ulong)(iVar37 >> 0x1f & uVar40);
                    bVar43 = uVar36 < 0x2000000;
                    uVar36 = uVar40;
                    if (bVar43) {
                      uVar36 = uVar40 << 8;
                      RangeEnc_ShiftLow(local_180);
                    }
                    pCVar6 = local_180;
                    iVar37 = iVar37 * 2;
                  } while (iVar37 != -0x10000000);
                  uVar21 = (uint)local_160 & 1;
                  uVar4 = p->posAlignEncoder[1];
                  uVar20 = (uVar36 >> 0xb) * (uint)uVar4;
                  uVar40 = -uVar21 & uVar20;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar40;
                  uVar40 = (uVar20 & uVar21 - 1) + ((uVar36 & -uVar21) - uVar40);
                  p->posAlignEncoder[1] =
                       (short)(((uVar21 - 1 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                  if (uVar40 < 0x1000000) {
                    uVar40 = uVar40 * 0x100;
                    RangeEnc_ShiftLow(local_180);
                  }
                  uVar21 = uVar21 | 2;
                  uVar36 = (uint)((ulong)local_160 >> 1) & 1;
                  uVar4 = p->posAlignEncoder[uVar21];
                  uVar41 = (uVar40 >> 0xb) * (uint)uVar4;
                  uVar20 = -uVar36 & uVar41;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar20;
                  uVar40 = (uVar41 & uVar36 - 1) + ((uVar40 & -uVar36) - uVar20);
                  p->posAlignEncoder[uVar21] =
                       (short)(((uVar36 - 1 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                  if (uVar40 < 0x1000000) {
                    uVar40 = uVar40 * 0x100;
                    RangeEnc_ShiftLow(pCVar6);
                  }
                  uVar36 = uVar36 + uVar21 * 2;
                  uVar21 = uVar24 >> 2 & 1;
                  uVar4 = p->posAlignEncoder[uVar36];
                  uVar41 = (uVar40 >> 0xb) * (uint)uVar4;
                  uVar20 = -uVar21 & uVar41;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar20;
                  uVar40 = (uVar41 & uVar21 - 1) + ((uVar40 & -uVar21) - uVar20);
                  p->posAlignEncoder[uVar36] =
                       (short)(((uVar21 - 1 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                  if (uVar40 < 0x1000000) {
                    uVar40 = uVar40 * 0x100;
                    RangeEnc_ShiftLow(pCVar6);
                  }
                  pCVar6 = local_180;
                  uVar41 = uVar24 >> 3 & 1;
                  uVar25 = (ulong)(uVar21 * 2 + uVar36 * 4);
                  uVar4 = *(ushort *)((long)p->posAlignEncoder + uVar25);
                  uVar36 = (uVar40 >> 0xb) * (uint)uVar4;
                  uVar24 = -uVar41;
                  uVar20 = uVar24 & uVar36;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar20;
                  uVar41 = uVar41 - 1;
                  uVar24 = (uVar36 & uVar41) + ((uVar40 & uVar24) - uVar20);
                  *(ushort *)((long)p->posAlignEncoder + uVar25) =
                       (short)(((uVar41 & 0x7e1) - (uint)uVar4) + 0x1f >> 5) + uVar4;
                  if (uVar24 < 0x1000000) {
                    uVar24 = uVar24 * 0x100;
                    RangeEnc_ShiftLow(local_180);
                  }
                  pCVar6->range = uVar24;
                }
              }
            }
          }
          ProbPrices = local_140;
          local_194 = local_194 + UVar8;
          iVar37 = 0;
          puVar2 = &p->additionalOffset;
          *puVar2 = *puVar2 - UVar8;
          if (*puVar2 == 0) {
            if (p->fastMode == 0) {
              if (0x3f < p->matchPriceCount) {
                FillAlignPrices(p);
                FillDistancesPrices(p);
                LenPriceEnc_UpdateTables(local_58,1 << ((byte)p->pb & 0x1f),local_98,ProbPrices);
              }
              if (p->repLenEncCounter < 1) {
                p->repLenEncCounter = 0x40;
                LenPriceEnc_UpdateTables(local_68,1 << ((byte)p->pb & 0x1f),local_a0,ProbPrices);
              }
            }
            UVar8 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
            if (UVar8 == 0) {
              iVar37 = 2;
            }
            else {
              uVar24 = local_194 - (int)local_90;
              iVar37 = 0;
              if (local_dc == 0) {
                if (0x1ffff < uVar24) {
                  p->nowPos64 = p->nowPos64 + (ulong)uVar24;
                  local_150 = p->result;
                  iVar37 = 1;
                  if (local_150 == 0) {
                    if ((p->rc).res != 0) {
                      p->result = 9;
                    }
                    if ((p->matchFinderBase).result != 0) {
                      p->result = 8;
                    }
                    local_150 = p->result;
                    if (local_150 != 0) {
                      p->finished = 1;
                    }
                  }
                }
              }
              else if ((local_cc <= uVar24 + 0x92c) ||
                      (local_50 <=
                       (p->rc).buf +
                       (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x4000)) {
                iVar37 = 2;
              }
            }
          }
        } while (iVar37 == 0);
        if (iVar37 != 2) {
          return local_150;
        }
      }
      p->nowPos64 = p->nowPos64 + (ulong)(local_194 - (int)local_90);
      SVar9 = Flush(p,local_194);
      return SVar9;
    }
  }
  return local_150;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p, UInt32 maxPackSize, UInt32 maxUnpackSize)
{
  UInt32 nowPos32, startPos32;
  if (p->needInit)
  {
    #ifndef Z7_ST
    if (p->mtMode)
    {
      RINOK(MatchFinderMt_InitMt(&p->matchFinderMt))
    }
    #endif
    p->matchFinder.Init(p->matchFinderObj);
    p->needInit = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p))

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0)
  {
    unsigned numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit_0(&p->rc, &p->isMatch[kState_Start][0]);
    // p->state = kLiteralNextStates[p->state];
    curByte = *(p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
  
  for (;;)
  {
    UInt32 dist;
    unsigned len, posState;
    UInt32 range, ttt, newBound;
    CLzmaProb *probs;
  
    if (p->fastMode)
      len = GetOptimumFast(p);
    else
    {
      unsigned oci = p->optCur;
      if (p->optEnd == oci)
        len = GetOptimum(p, nowPos32);
      else
      {
        const COptimal *opt = &p->opt[oci];
        len = opt->len;
        p->backRes = opt->dist;
        p->optCur = oci + 1;
      }
    }

    posState = (unsigned)nowPos32 & p->pbMask;
    range = p->rc.range;
    probs = &p->isMatch[p->state][posState];
    
    RC_BIT_PRE(&p->rc, probs)
    
    dist = p->backRes;

    #ifdef SHOW_STAT2
    printf("\n pos = %6X, len = %3u  pos = %6u", nowPos32, len, dist);
    #endif

    if (dist == MARK_LIT)
    {
      Byte curByte;
      const Byte *data;
      unsigned state;

      RC_BIT_0(&p->rc, probs)
      p->rc.range = range;
      data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
      probs = LIT_PROBS(nowPos32, *(data - 1));
      curByte = *data;
      state = p->state;
      p->state = kLiteralNextStates[state];
      if (IsLitState(state))
        LitEnc_Encode(&p->rc, probs, curByte);
      else
        LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0]));
    }
    else
    {
      RC_BIT_1(&p->rc, probs)
      probs = &p->isRep[p->state];
      RC_BIT_PRE(&p->rc, probs)
      
      if (dist < LZMA_NUM_REPS)
      {
        RC_BIT_1(&p->rc, probs)
        probs = &p->isRepG0[p->state];
        RC_BIT_PRE(&p->rc, probs)
        if (dist == 0)
        {
          RC_BIT_0(&p->rc, probs)
          probs = &p->isRep0Long[p->state][posState];
          RC_BIT_PRE(&p->rc, probs)
          if (len != 1)
          {
            RC_BIT_1_BASE(&p->rc, probs)
          }
          else
          {
            RC_BIT_0_BASE(&p->rc, probs)
            p->state = kShortRepNextStates[p->state];
          }
        }
        else
        {
          RC_BIT_1(&p->rc, probs)
          probs = &p->isRepG1[p->state];
          RC_BIT_PRE(&p->rc, probs)
          if (dist == 1)
          {
            RC_BIT_0_BASE(&p->rc, probs)
            dist = p->reps[1];
          }
          else
          {
            RC_BIT_1(&p->rc, probs)
            probs = &p->isRepG2[p->state];
            RC_BIT_PRE(&p->rc, probs)
            if (dist == 2)
            {
              RC_BIT_0_BASE(&p->rc, probs)
              dist = p->reps[2];
            }
            else
            {
              RC_BIT_1_BASE(&p->rc, probs)
              dist = p->reps[3];
              p->reps[3] = p->reps[2];
            }
            p->reps[2] = p->reps[1];
          }
          p->reps[1] = p->reps[0];
          p->reps[0] = dist;
        }

        RC_NORM(&p->rc)

        p->rc.range = range;

        if (len != 1)
        {
          LenEnc_Encode(&p->repLenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
          --p->repLenEncCounter;
          p->state = kRepNextStates[p->state];
        }
      }
      else
      {
        unsigned posSlot;
        RC_BIT_0(&p->rc, probs)
        p->rc.range = range;
        p->state = kMatchNextStates[p->state];

        LenEnc_Encode(&p->lenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
        // --p->lenEnc.counter;

        dist -= LZMA_NUM_REPS;
        p->reps[3] = p->reps[2];
        p->reps[2] = p->reps[1];
        p->reps[1] = p->reps[0];
        p->reps[0] = dist + 1;
        
        p->matchPriceCount++;
        GetPosSlot(dist, posSlot)
        // RcTree_Encode_PosSlot(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], posSlot);
        {
          UInt32 sym = (UInt32)posSlot + (1 << kNumPosSlotBits);
          range = p->rc.range;
          probs = p->posSlotEncoder[GetLenToPosState(len)];
          do
          {
            CLzmaProb *prob = probs + (sym >> kNumPosSlotBits);
            UInt32 bit = (sym >> (kNumPosSlotBits - 1)) & 1;
            sym <<= 1;
            RC_BIT(&p->rc, prob, bit)
          }
          while (sym < (1 << kNumPosSlotBits * 2));
          p->rc.range = range;
        }
        
        if (dist >= kStartPosModelIndex)
        {
          unsigned footerBits = ((posSlot >> 1) - 1);

          if (dist < kNumFullDistances)
          {
            unsigned base = ((2 | (posSlot & 1)) << footerBits);
            RcTree_ReverseEncode(&p->rc, p->posEncoders + base, footerBits, (unsigned)(dist /* - base */));
          }
          else
          {
            UInt32 pos2 = (dist | 0xF) << (32 - footerBits);
            range = p->rc.range;
            // RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
            /*
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - ((dist >> --footerBits) & 1));
              RC_NORM(&p->rc)
            }
            while (footerBits > kNumAlignBits);
            */
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - (pos2 >> 31));
              pos2 += pos2;
              RC_NORM(&p->rc)
            }
            while (pos2 != 0xF0000000);


            // RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);

            {
              unsigned m = 1;
              unsigned bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1;             RC_BIT(&p->rc, p->posAlignEncoder + m, bit)
              p->rc.range = range;
              // p->alignPriceCount++;
            }
          }
        }
      }
    }

    nowPos32 += (UInt32)len;
    p->additionalOffset -= len;
    
    if (p->additionalOffset == 0)
    {
      UInt32 processed;

      if (!p->fastMode)
      {
        /*
        if (p->alignPriceCount >= 16) // kAlignTableSize
          FillAlignPrices(p);
        if (p->matchPriceCount >= 128)
          FillDistancesPrices(p);
        if (p->lenEnc.counter <= 0)
          LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, &p->lenProbs, p->ProbPrices);
        */
        if (p->matchPriceCount >= 64)
        {
          FillAlignPrices(p);
          // { int y; for (y = 0; y < 100; y++) {
          FillDistancesPrices(p);
          // }}
          LenPriceEnc_UpdateTables(&p->lenEnc, (unsigned)1 << p->pb, &p->lenProbs, p->ProbPrices);
        }
        if (p->repLenEncCounter <= 0)
        {
          p->repLenEncCounter = REP_LEN_COUNT;
          LenPriceEnc_UpdateTables(&p->repLenEnc, (unsigned)1 << p->pb, &p->repLenProbs, p->ProbPrices);
        }
      }
    
      if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
        break;
      processed = nowPos32 - startPos32;
      
      if (maxPackSize)
      {
        if (processed + kNumOpts + 300 >= maxUnpackSize
            || RangeEnc_GetProcessed_sizet(&p->rc) + kPackReserve >= maxPackSize)
          break;
      }
      else if (processed >= (1 << 17))
      {
        p->nowPos64 += nowPos32 - startPos32;
        return CheckErrors(p);
      }
    }
  }

  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}